

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

CharPtr __thiscall
fmt::BasicWriter<char>::prepare_int_buffer<fmt::FormatSpec>
          (BasicWriter<char> *this,uint num_digits,FormatSpec *spec,char *prefix,uint prefix_size)

{
  byte bVar1;
  Alignment AVar2;
  int iVar3;
  Buffer<char> *pBVar4;
  size_t sVar5;
  CharPtr pcVar6;
  Buffer<char> *pBVar7;
  uint uVar8;
  size_t __len_1;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  size_t __len_2;
  ulong uVar12;
  size_t __len;
  size_t size;
  char *__dest;
  char *pcVar13;
  char __tmp;
  AlignSpec subspec;
  AlignSpec local_3c;
  
  uVar11 = (spec->super_AlignSpec).super_WidthSpec.width_;
  uVar12 = (ulong)uVar11;
  AVar2 = (spec->super_AlignSpec).align_;
  bVar1 = (byte)(spec->super_AlignSpec).super_WidthSpec.fill_;
  iVar3 = spec->precision_;
  if ((int)num_digits < iVar3) {
    if (prefix_size == 0) {
      prefix_size = 0;
    }
    else if (prefix[prefix_size - 1] == '0') {
      prefix_size = prefix_size - 1;
    }
    if (-1 < iVar3) {
      uVar8 = iVar3 + prefix_size;
      local_3c.super_WidthSpec.fill_ = L'0';
      local_3c.align_ = ALIGN_NUMERIC;
      local_3c.super_WidthSpec.width_ = uVar8;
      if (uVar8 < uVar11) {
        pBVar4 = this->buffer_;
        if (pBVar4->capacity_ < uVar12) {
          (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
        }
        uVar11 = uVar11 - uVar8;
        if (AVar2 == ALIGN_LEFT) {
          pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
          pBVar4 = this->buffer_;
          sVar5 = pBVar4->size_;
          uVar12 = sVar5 + uVar11;
          pBVar7 = pBVar4;
          if (pBVar4->capacity_ < uVar12) {
            (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
            pBVar7 = this->buffer_;
          }
          pBVar4->size_ = uVar12;
          memset(pBVar7->ptr_ + sVar5,(uint)bVar1,(ulong)uVar11);
          return pcVar6;
        }
        pBVar4 = this->buffer_;
        sVar5 = pBVar4->size_;
        uVar12 = sVar5 + uVar11;
        pBVar7 = pBVar4;
        if (pBVar4->capacity_ < uVar12) {
          (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
          pBVar7 = this->buffer_;
        }
        pBVar4->size_ = uVar12;
        memset(pBVar7->ptr_ + sVar5,(uint)bVar1,(ulong)uVar11);
      }
      pcVar6 = prepare_int_buffer<fmt::AlignSpec>(this,num_digits,&local_3c,prefix,prefix_size);
      return pcVar6;
    }
    __assert_fail("(value >= 0) && \"negative value\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jai1[P]spdlog_example/include/spdlog/fmt/bundled/format.h"
                  ,0x30c,
                  "typename MakeUnsigned<Int>::Type fmt::internal::to_unsigned(Int) [Int = int]");
  }
  uVar8 = prefix_size + num_digits;
  pBVar4 = this->buffer_;
  sVar5 = pBVar4->size_;
  if (uVar11 <= uVar8) {
    uVar12 = sVar5 + uVar8;
    pBVar7 = pBVar4;
    if (pBVar4->capacity_ < uVar12) {
      (**pBVar4->_vptr_Buffer)(pBVar4,uVar12);
      pBVar7 = this->buffer_;
    }
    pBVar4->size_ = uVar12;
    pcVar13 = pBVar7->ptr_;
    if (prefix_size != 0) {
      memmove(pcVar13 + sVar5,prefix,(ulong)prefix_size);
    }
    pcVar13 = pcVar13 + sVar5 + uVar8;
    goto LAB_0010c57b;
  }
  uVar9 = sVar5 + uVar12;
  pBVar7 = pBVar4;
  if (pBVar4->capacity_ < uVar9) {
    (**pBVar4->_vptr_Buffer)(pBVar4,uVar9);
    pBVar7 = this->buffer_;
  }
  uVar10 = (ulong)uVar8;
  pBVar4->size_ = uVar9;
  __dest = pBVar7->ptr_ + sVar5;
  pcVar13 = __dest + uVar12;
  if (AVar2 == ALIGN_NUMERIC) {
    if (prefix_size != 0) {
      memmove(__dest,prefix,(ulong)prefix_size);
      __dest = __dest + prefix_size;
      uVar8 = num_digits;
    }
  }
  else {
    if (AVar2 == ALIGN_CENTER) {
      uVar12 = uVar12 - uVar10;
      uVar9 = uVar12 >> 1;
      if (1 < uVar12) {
        memset(__dest,(uint)bVar1,uVar9);
      }
      pcVar13 = __dest + uVar9 + uVar10;
      memset(pcVar13,(uint)bVar1,uVar12 - uVar9);
      if (prefix_size != 0) {
        memmove(__dest + uVar9,prefix,(ulong)prefix_size);
      }
      goto LAB_0010c57b;
    }
    if (AVar2 == ALIGN_LEFT) {
      if (prefix_size != 0) {
        memmove(__dest,prefix,(ulong)prefix_size);
      }
      pcVar13 = __dest + uVar10;
      memset(pcVar13,(uint)bVar1,uVar12 - uVar10);
      goto LAB_0010c57b;
    }
    if (prefix_size != 0) {
      memmove(pcVar13 + -uVar10,prefix,(ulong)prefix_size);
    }
  }
  if (pcVar13 + (-(long)__dest - (ulong)uVar8) != (char *)0x0) {
    memset(__dest,(uint)bVar1,(size_t)(pcVar13 + (-(long)__dest - (ulong)uVar8)));
  }
LAB_0010c57b:
  return pcVar13 + -1;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::prepare_int_buffer(
    unsigned num_digits, const Spec &spec, const char *prefix, unsigned prefix_size)
{
    unsigned width = spec.width();
    Alignment align = spec.align();
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.precision() > static_cast<int>(num_digits))
    {
        // Octal prefix '0' is counted as a digit, so ignore it if precision
        // is specified.
        if (prefix_size > 0 && prefix[prefix_size - 1] == '0')
            --prefix_size;
        unsigned number_size = prefix_size + internal::to_unsigned(spec.precision());
        AlignSpec subspec(number_size, '0', ALIGN_NUMERIC);
        if (number_size >= width)
            return prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        buffer_.reserve(width);
        unsigned fill_size = width - number_size;
        if (align != ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        CharPtr result = prepare_int_buffer(num_digits, subspec, prefix, prefix_size);
        if (align == ALIGN_LEFT)
        {
            CharPtr p = grow_buffer(fill_size);
            std::uninitialized_fill(p, p + fill_size, fill);
        }
        return result;
    }
    unsigned size = prefix_size + num_digits;
    if (width <= size)
    {
        CharPtr p = grow_buffer(size);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        return p + size - 1;
    }
    CharPtr p = grow_buffer(width);
    CharPtr end = p + width;
    if (align == ALIGN_LEFT)
    {
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
        std::uninitialized_fill(p, end, fill);
    }
    else if (align == ALIGN_CENTER)
    {
        p = fill_padding(p, width, size, fill);
        std::uninitialized_copy(prefix, prefix + prefix_size, p);
        p += size;
    }
    else
    {
        if (align == ALIGN_NUMERIC)
        {
            if (prefix_size != 0)
            {
                p = std::uninitialized_copy(prefix, prefix + prefix_size, p);
                size -= prefix_size;
            }
        }
        else
        {
            std::uninitialized_copy(prefix, prefix + prefix_size, end - size);
        }
        std::uninitialized_fill(p, end - size, fill);
        p = end;
    }
    return p - 1;
}